

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC16.cpp
# Opt level: O0

void __thiscall CRC16::CRC16(CRC16 *this,void *buf,size_t len,uint16_t init_)

{
  uint16_t init__local;
  size_t len_local;
  void *buf_local;
  CRC16 *this_local;
  
  this->m_crc = 0xffff;
  std::call_once<void(&)()>(&flag,init_crc_table);
  init(this,(EVP_PKEY_CTX *)(ulong)init_);
  add(this,buf,len);
  return;
}

Assistant:

CRC16::CRC16(const void* buf, size_t len, uint16_t init_)
{
    std::call_once(flag, init_crc_table);
    init(init_);
    add(buf, len);
}